

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall
helics::Federate::registerConnectorInterfacesJsonDetail(Federate *this,JsonBuffer *jsonBuffer)

{
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  Core *pCVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  string_view inputType_00;
  string_view endpointType;
  string_view outputType_00;
  string_view units;
  pointer pbVar11;
  iterator iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  bool bVar16;
  bool cloning;
  bool global;
  bool bVar17;
  FilterTypes opType;
  int iVar18;
  TranslatorTypes ttype;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar19;
  const_reference pvVar20;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar21;
  anon_class_8_1_552cbcb6 callback;
  reference pbVar22;
  anon_class_8_1_a8116966 callback_00;
  InvalidParameter *pIVar23;
  char *extraout_RDX;
  char *extraout_RDX_00;
  PotentialInterfacesManager *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view filterType;
  string_view translatorType;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view fmt;
  string_view message_04;
  string_view name;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  string_view fmt_00;
  string_view message_09;
  string_view defVal;
  string_view defVal_00;
  format_args args;
  format_args args_00;
  string_view name_00;
  bool defaultGlobal;
  allocator<char> local_399;
  iterator __begin4;
  iterator __end4;
  value_type targets_1;
  allocator<char> local_329;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  value_type targets;
  allocator<char> local_2e2;
  allocator<char> local_2e1;
  string info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string inputType;
  string operation;
  string outputType;
  string key;
  data local_1f0;
  data local_1e0;
  key_type local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  size_type local_b0;
  pointer pcStack_a8;
  size_type local_a0;
  pointer pcStack_98;
  size_type local_90;
  pointer pcStack_88;
  size_type local_80;
  pointer pcStack_78;
  const_iterator __end2;
  const_iterator __begin2;
  
  this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)jsonBuffer->reference;
  defaultGlobal = false;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin4,"defaultglobal",(allocator<char> *)&__end4);
  fileops::replaceIfMember((json *)this_00,(string *)&__begin4,&defaultGlobal);
  std::__cxx11::string::~string((string *)&__begin4);
  bVar16 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[11],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)this_00,(char (*) [11])0x39e56e);
  pbVar19 = this_00;
  if (bVar16) {
    pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(this_00,"interfaces");
  }
  bVar16 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[8],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)pbVar19,(char (*) [8])0x3a25ca);
  if (bVar16) {
    pvVar20 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar19,"filters");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin(&__begin2,pvVar20);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cend(&__end2,pvVar20);
    while( true ) {
      bVar16 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         (&__begin2,&__end2);
      if (!bVar16) break;
      pbVar21 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&__begin2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"name",(allocator<char> *)&__end4);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_R9;
      fileops::getOrDefault
                (&key,(fileops *)pbVar21,(json *)&__begin4,(string *)0x0,
                 (string_view)(auVar3 << 0x40));
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"inputType",(allocator<char> *)&__end4);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = in_R9;
      fileops::getOrDefault
                (&inputType,(fileops *)pbVar21,(json *)&__begin4,(string *)0x0,
                 (string_view)(auVar4 << 0x40));
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"outputType",(allocator<char> *)&__end4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = in_R9;
      fileops::getOrDefault
                (&outputType,(fileops *)pbVar21,(json *)&__begin4,(string *)0x0,
                 (string_view)(auVar5 << 0x40));
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"cloning",(allocator<char> *)&__end4);
      cloning = fileops::getOrDefault
                          ((json *)pbVar21,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,false);
      std::__cxx11::string::~string((string *)&__begin4);
      bVar16 = outputType._M_string_length != 0;
      bVar17 = inputType._M_string_length != 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"global",(allocator<char> *)&__end4);
      global = fileops::getOrDefault
                         ((json *)pbVar21,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &__begin4,defaultGlobal);
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"operation",(allocator<char> *)local_328._M_pod_data);
      if (cloning) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&__end4,"clone",&local_2e1);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&__end4,"custom",&local_2e2);
      }
      defVal._M_str = (char *)in_R9.values_;
      defVal._M_len = (size_t)__end4.m_object;
      fileops::getOrDefault
                (&operation,(fileops *)pbVar21,(json *)&__begin4,
                 (string *)__end4.m_it.object_iterator._M_node,defVal);
      std::__cxx11::string::~string((string *)&__end4);
      std::__cxx11::string::~string((string *)&__begin4);
      filterType._M_str = extraout_RDX;
      filterType._M_len = (size_t)operation._M_dataplus._M_p;
      opType = filterTypeFromString((helics *)operation._M_string_length,filterType);
      bVar16 = checkValidFilterType(this,bVar16 || bVar17,opType,&operation);
      if (bVar16) {
        local_80 = inputType._M_string_length;
        pcStack_78 = inputType._M_dataplus._M_p;
        local_90 = outputType._M_string_length;
        pcStack_88 = outputType._M_dataplus._M_p;
        in_R9._4_4_ = 0;
        in_R9._0_4_ = opType;
        inputType_00._M_str = inputType._M_dataplus._M_p;
        inputType_00._M_len = inputType._M_string_length;
        outputType_00._M_str = outputType._M_dataplus._M_p;
        outputType_00._M_len = outputType._M_string_length;
        name_00._M_str = key._M_dataplus._M_p;
        name_00._M_len = key._M_string_length;
        callback.filter =
             generateFilter(this,global,cloning,name_00,opType,inputType_00,outputType_00);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"flags",(allocator<char> *)&local_2a0);
        info._M_dataplus._M_p = (pointer)callback.filter;
        info._M_string_length = (size_type)this;
        bVar16 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)pbVar21,(key_type *)&targets_1);
        if (bVar16) {
          pvVar20 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar21,(key_type *)&targets_1);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json(&targets,pvVar20);
          if (targets.m_data.m_type == array) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::begin(&__begin4,&targets);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::end(&__end4,&targets);
            while (bVar16 = nlohmann::json_abi_v3_11_3::detail::
                            iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            ::
                            operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                      ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__begin4,&__end4), bVar16) {
              pbVar22 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)&__begin4);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_328,pbVar22);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
              ::anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)&info,(string *)&local_328);
              std::__cxx11::string::~string((string *)local_328._M_pod_data);
              nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&__begin4);
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,&targets);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)&info,(string *)&__begin4);
            std::__cxx11::string::~string((string *)&__begin4);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&targets.m_data);
        }
        if (*(char *)(CONCAT71(targets_1.m_data._1_7_,targets_1.m_data.m_type) + -1 +
                     (long)targets_1.m_data.m_value.object) == 's') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets_1);
          bVar16 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)pbVar21,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &targets_1);
          if (bVar16) {
            pvVar20 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar21,(key_type *)&targets_1);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,pvVar20);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Filter>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)&info,(string *)&__begin4);
            std::__cxx11::string::~string((string *)&__begin4);
          }
        }
        std::__cxx11::string::~string((string *)&targets_1);
        __begin4.m_object = (pointer)0x0;
        __begin4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        __begin4.m_it.primitive_iterator.m_it =
             (difference_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_invoke;
        __begin4.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)std::
                _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
                ::_M_manager;
        __end4.m_object = (pointer)0x0;
        __end4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        __end4.m_it.primitive_iterator.m_it =
             (difference_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_invoke;
        local_328._8_8_ = 0;
        __end4.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)std::
                _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
                ::_M_manager;
        local_310 = std::
                    _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
                    ::_M_invoke;
        local_318 = std::
                    _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
                    ::_M_manager;
        local_328._M_unused._0_8_ = callback.filter;
        processOptions((json *)pbVar21,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&__begin4,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&__end4,(function<void_(int,_int)> *)&local_328);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_328);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&__end4);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&__begin4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin4,"info",(allocator<char> *)&__end4);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = in_R9;
        fileops::getOrDefault
                  (&info,(fileops *)pbVar21,(json *)&__begin4,(string *)0x0,
                   (string_view)(auVar6 << 0x40));
        std::__cxx11::string::~string((string *)&__begin4);
        if (info._M_string_length != 0) {
          pCVar1 = ((callback.filter)->super_Interface).mCore;
          (*pCVar1->_vptr_Core[0x60])
                    (pCVar1,(ulong)(uint)((callback.filter)->super_Interface).handle.hid);
        }
        __begin4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        __begin4.m_it.primitive_iterator.m_it =
             (difference_type)
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_invoke;
        __begin4.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)std::
                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
                ::_M_manager;
        __begin4.m_object = (pointer)callback.filter;
        loadTags((json *)pbVar21,
                 (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&__begin4);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&__begin4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets,"source",(allocator<char> *)&local_2c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"targets",&local_399);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_2a0);
        bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                           ((json *)pbVar21,(string *)&__begin4,
                            (anon_class_8_1_a8116966)callback.filter);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets,&local_2a0);
          bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                             ((json *)pbVar21,(string *)&__end4,
                              (anon_class_8_1_a8116966)callback.filter);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_2a0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_2a0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets,&local_2a0);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_4_>
                      ((json *)pbVar21,(string *)&local_328,(anon_class_8_1_a8116966)callback.filter
                      );
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&targets);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets,"destination",&local_399);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"targets",&local_329);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_2c0);
        bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                           ((json *)pbVar21,(string *)&__begin4,
                            (anon_class_8_1_a8116966)callback.filter);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets,&local_2c0);
          bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                             ((json *)pbVar21,(string *)&__end4,
                              (anon_class_8_1_a8116966)callback.filter);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_2c0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_2c0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets,&local_2c0);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Filter>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Filter&)::_lambda(std::__cxx11::string_const&)_5_>
                      ((json *)pbVar21,(string *)&local_328,(anon_class_8_1_a8116966)callback.filter
                      );
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&targets);
        std::__cxx11::string::~string((string *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"endpoints",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_d0);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                           ((json *)pbVar21,(string *)&__begin4,callback);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_d0);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                             ((json *)pbVar21,(string *)&__end4,callback);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_d0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_d0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_d0);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__3>
                      ((json *)pbVar21,(string *)&local_328,callback);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"endpoints",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_f0);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                           ((json *)pbVar21,(string *)&__begin4,callback);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_f0);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                             ((json *)pbVar21,(string *)&__end4,callback);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_f0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_f0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_f0);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__4>
                      ((json *)pbVar21,(string *)&local_328,callback);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&targets_1);
        if (cloning) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d0,"delivery",(allocator<char> *)&targets);
          info._M_dataplus._M_p = (pointer)callback.filter;
          bVar16 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)pbVar21,&local_1d0);
          if (bVar16) {
            pvVar20 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar21,&local_1d0);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::basic_json(&targets_1,pvVar20);
            if (targets_1.m_data.m_type == array) {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::begin(&__begin4,&targets_1);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::end(&__end4,&targets_1);
              while (bVar16 = nlohmann::json_abi_v3_11_3::detail::
                              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              ::
                              operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                        ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                          *)&__begin4,&__end4), bVar16) {
                pbVar22 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                       *)&__begin4);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&local_328,pbVar22);
                registerConnectorInterfacesJsonDetail::anon_class_8_1_552cbcb6::operator()
                          ((anon_class_8_1_552cbcb6 *)&info,(string *)&local_328);
                std::__cxx11::string::~string((string *)local_328._M_pod_data);
                nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                              *)&__begin4);
              }
            }
            else {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__begin4,&targets_1);
              registerConnectorInterfacesJsonDetail::anon_class_8_1_552cbcb6::operator()
                        ((anon_class_8_1_552cbcb6 *)&info,(string *)&__begin4);
              std::__cxx11::string::~string((string *)&__begin4);
            }
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&targets_1.m_data);
          }
          if (local_1d0._M_dataplus._M_p[local_1d0._M_string_length - 1] == 's') {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back(&local_1d0);
            bVar16 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)pbVar21,&local_1d0);
            if (bVar16) {
              pvVar20 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)pbVar21,&local_1d0);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__begin4,pvVar20);
              registerConnectorInterfacesJsonDetail::anon_class_8_1_552cbcb6::operator()
                        ((anon_class_8_1_552cbcb6 *)&info,(string *)&__begin4);
              std::__cxx11::string::~string((string *)&__begin4);
            }
          }
          std::__cxx11::string::~string((string *)&local_1d0);
        }
        bVar16 = this->strictConfigChecking;
        bVar17 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::contains<const_char_(&)[11],_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)pbVar21,(char (*) [11])"properties");
        if (bVar17) {
          pbVar21 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>(pbVar21,"properties");
          if (*pbVar21 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x2) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::cbegin((const_iterator *)&__begin4,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)pbVar21);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::cend((const_iterator *)&__end4,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)pbVar21);
            while (bVar17 = nlohmann::json_abi_v3_11_3::detail::
                            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            ::
                            operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                      ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__begin4,
                                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__end4), bVar17) {
              pbVar21 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__begin4);
              bVar17 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::contains<const_char_(&)[5],_0>
                                 ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)pbVar21,(char (*) [5])0x39312d);
              if ((bVar17) &&
                 (bVar17 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           ::contains<const_char_(&)[6],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)pbVar21,(char (*) [6])0x3748f1), bVar17)) {
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar21,"value");
                if ((byte)((pvVar20->m_data).m_type - number_integer) < 3) {
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar21,"name");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_328,pvVar20);
                  uVar14 = local_328._8_8_;
                  uVar13 = local_328._M_unused._0_8_;
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar21,"value");
                  dVar2 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::get_impl<double,_0>(pvVar20);
                  (*((callback.filter)->super_Interface)._vptr_Interface[5])
                            (SUB84(dVar2,0),callback.filter,uVar14,uVar13);
                }
                else {
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar21,"name");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_328,pvVar20);
                  uVar14 = local_328._8_8_;
                  uVar13 = local_328._M_unused._0_8_;
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar21,"value");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&targets_1,pvVar20);
                  (*((callback.filter)->super_Interface)._vptr_Interface[6])
                            (callback.filter,uVar14,uVar13);
                  std::__cxx11::string::~string((string *)&targets_1);
                }
                std::__cxx11::string::~string((string *)local_328._M_pod_data);
              }
              else {
                if (bVar16 != false) goto LAB_001feb52;
                message_02._M_str = "interface properties require \"name\" and \"value\" fields";
                message_02._M_len = 0x36;
                logMessage(this,3,message_02);
              }
              nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&__begin4);
            }
          }
          else {
            bVar17 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::contains<const_char_(&)[5],_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)pbVar21,(char (*) [5])0x39312d);
            if ((bVar17) &&
               (bVar17 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         ::contains<const_char_(&)[6],_0>
                                   ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)pbVar21,(char (*) [6])0x3748f1), bVar17)) {
              pvVar20 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar21,"value");
              if ((byte)((pvVar20->m_data).m_type - number_integer) < 3) {
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar21,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,pvVar20);
                iVar12 = __begin4.m_it.object_iterator;
                pbVar11 = __begin4.m_object;
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar21,"value");
                dVar2 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::get_impl<double,_0>(pvVar20);
                (*((callback.filter)->super_Interface)._vptr_Interface[5])
                          (SUB84(dVar2,0),callback.filter,iVar12._M_node,pbVar11);
              }
              else {
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar21,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__begin4,pvVar20);
                iVar12 = __begin4.m_it.object_iterator;
                pbVar11 = __begin4.m_object;
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar21,"value");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&__end4,pvVar20);
                (*((callback.filter)->super_Interface)._vptr_Interface[6])
                          (callback.filter,iVar12._M_node,pbVar11);
                std::__cxx11::string::~string((string *)&__end4);
              }
              std::__cxx11::string::~string((string *)&__begin4);
            }
            else {
              if (bVar16 != false) {
LAB_001feb52:
                message_07._M_str = "interface properties require \"name\" and \"value\" fields";
                message_07._M_len = 0x36;
                logMessage(this,0,message_07);
                pIVar23 = (InvalidParameter *)__cxa_allocate_exception(0x28);
                message._M_str = "interface properties require \"name\" and \"value\" fields";
                message._M_len = 0x36;
                InvalidParameter::InvalidParameter(pIVar23,message);
                __cxa_throw(pIVar23,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_03._M_str = "interface properties require \"name\" and \"value\" fields";
              message_03._M_len = 0x36;
              logMessage(this,3,message_03);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&operation);
      std::__cxx11::string::~string((string *)&outputType);
      std::__cxx11::string::~string((string *)&inputType);
      std::__cxx11::string::~string((string *)&key);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++(&__begin2);
    }
  }
  bVar16 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[12],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)pbVar19,(char (*) [12])0x39dc32);
  if (bVar16) {
    pvVar20 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar19,"translators");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin(&__begin2,pvVar20);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cend(&__end2,pvVar20);
    while( true ) {
      bVar16 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         (&__begin2,&__end2);
      if (!bVar16) break;
      pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&__begin2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"name",(allocator<char> *)&__end4);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = in_R9;
      fileops::getOrDefault
                (&key,(fileops *)pbVar19,(json *)&__begin4,(string *)0x0,
                 (string_view)(auVar7 << 0x40));
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"type",(allocator<char> *)local_328._M_pod_data);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__end4,"custom",(allocator<char> *)&targets_1);
      defVal_00._M_str = (char *)in_R9.values_;
      defVal_00._M_len = (size_t)__end4.m_object;
      fileops::getOrDefault
                (&inputType,(fileops *)pbVar19,(json *)&__begin4,
                 (string *)__end4.m_it.object_iterator._M_node,defVal_00);
      std::__cxx11::string::~string((string *)&__end4);
      std::__cxx11::string::~string((string *)&__begin4);
      translatorType._M_str = extraout_RDX_00;
      translatorType._M_len = (size_t)inputType._M_dataplus._M_p;
      ttype = translatorTypeFromString((helics *)inputType._M_string_length,translatorType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"endpointtype",(allocator<char> *)&__end4);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = in_R9;
      fileops::getOrDefault
                (&outputType,(fileops *)pbVar19,(json *)&__begin4,(string *)0x0,
                 (string_view)(auVar8 << 0x40));
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"unit",(allocator<char> *)&__end4);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = in_R9;
      fileops::getOrDefault
                (&operation,(fileops *)pbVar19,(json *)&__begin4,(string *)0x0,
                 (string_view)(auVar9 << 0x40));
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"units",(allocator<char> *)&__end4);
      fileops::replaceIfMember((json *)pbVar19,(string *)&__begin4,(string *)&operation);
      std::__cxx11::string::~string((string *)&__begin4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&__begin4,"global",(allocator<char> *)&__end4);
      bVar16 = fileops::getOrDefault((json *)pbVar19,(string *)&__begin4,defaultGlobal);
      std::__cxx11::string::~string((string *)&__begin4);
      if (ttype == UNRECOGNIZED) {
        if (this->strictConfigChecking == true) {
          __end4.m_object = (pointer)inputType._M_dataplus._M_p;
          __end4.m_it.object_iterator._M_node = (_Base_ptr)inputType._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x1f;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)&__end4;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&__begin4,(v11 *)"unrecognized translator type:{}",fmt_00,args_00);
          message_09._M_str = (char *)__begin4.m_object;
          message_09._M_len = (size_t)__begin4.m_it.object_iterator._M_node;
          logMessage(this,0,message_09);
          pIVar23 = (InvalidParameter *)__cxa_allocate_exception(0x28);
          message_01._M_str = (char *)__begin4.m_object;
          message_01._M_len = (size_t)__begin4.m_it.object_iterator._M_node;
          InvalidParameter::InvalidParameter(pIVar23,message_01);
          __cxa_throw(pIVar23,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
        }
        __end4.m_object = (pointer)inputType._M_dataplus._M_p;
        __end4.m_it.object_iterator._M_node = (_Base_ptr)inputType._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x24;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)&__end4;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&__begin4,(v11 *)"unrecognized translator operation:{}",fmt,args);
        message_04._M_str = (char *)__begin4.m_object;
        message_04._M_len = (size_t)__begin4.m_it.object_iterator._M_node;
        logMessage(this,3,message_04);
        std::__cxx11::string::~string((string *)&__begin4);
      }
      else {
        local_a0 = outputType._M_string_length;
        pcStack_98 = outputType._M_dataplus._M_p;
        local_b0 = operation._M_string_length;
        pcStack_a8 = operation._M_dataplus._M_p;
        endpointType._M_str = outputType._M_dataplus._M_p;
        endpointType._M_len = outputType._M_string_length;
        units._M_str = operation._M_dataplus._M_p;
        units._M_len = operation._M_string_length;
        name._M_str = key._M_dataplus._M_p;
        name._M_len = key._M_string_length;
        callback_00.iface = generateTranslator(this,bVar16,name,ttype,endpointType,units);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"flags",(allocator<char> *)&local_2a0);
        info._M_dataplus._M_p = (pointer)callback_00.iface;
        info._M_string_length = (size_type)this;
        bVar16 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)pbVar19,(key_type *)&targets_1);
        if (bVar16) {
          pvVar20 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pbVar19,(key_type *)&targets_1);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::basic_json(&targets,pvVar20);
          if (targets.m_data.m_type == array) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::begin(&__begin4,&targets);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::end(&__end4,&targets);
            while (bVar16 = nlohmann::json_abi_v3_11_3::detail::
                            iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            ::
                            operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                      ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__begin4,
                                       (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__end4), bVar16) {
              pbVar22 = nlohmann::json_abi_v3_11_3::detail::
                        iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                        ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                     *)&__begin4);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_328,pbVar22);
              loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
              ::anon_class_16_2_14a9c628::operator()
                        ((anon_class_16_2_14a9c628 *)&info,(string *)&local_328);
              std::__cxx11::string::~string((string *)local_328._M_pod_data);
              nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&__begin4);
            }
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&__begin4,&targets);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)&info,(string *)&__begin4);
            std::__cxx11::string::~string((string *)&__begin4);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&targets.m_data);
        }
        if (*(char *)(CONCAT71(targets_1.m_data._1_7_,targets_1.m_data.m_type) + -1 +
                     (long)targets_1.m_data.m_value.object) == 's') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets_1);
          bVar16 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)pbVar19,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &targets_1);
          if (bVar16) {
            pvVar20 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pbVar19,(key_type *)&targets_1);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)&__begin4,pvVar20);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Translator>
            ::anon_class_16_2_14a9c628::operator()
                      ((anon_class_16_2_14a9c628 *)&info,(string *)&__begin4);
            std::__cxx11::string::~string((string *)&__begin4);
          }
        }
        std::__cxx11::string::~string((string *)&targets_1);
        __begin4.m_object = (pointer)0x0;
        __begin4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        __begin4.m_it.primitive_iterator.m_it =
             (difference_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
             ::_M_invoke;
        __begin4.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)std::
                _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1312:9)>
                ::_M_manager;
        __end4.m_object = (pointer)0x0;
        __end4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        __end4.m_it.primitive_iterator.m_it =
             (difference_type)
             std::
             _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
             ::_M_invoke;
        local_328._8_8_ = 0;
        __end4.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)std::
                _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1313:9)>
                ::_M_manager;
        local_310 = std::
                    _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
                    ::_M_invoke;
        local_318 = std::
                    _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1314:9)>
                    ::_M_manager;
        local_328._M_unused._0_8_ = callback_00.iface;
        processOptions((json *)pbVar19,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&__begin4,
                       (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&__end4,(function<void_(int,_int)> *)&local_328);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_328);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&__end4);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&__begin4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&__begin4,"info",(allocator<char> *)&__end4);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = in_R9;
        fileops::getOrDefault
                  (&info,(fileops *)pbVar19,(json *)&__begin4,(string *)0x0,
                   (string_view)(auVar10 << 0x40));
        std::__cxx11::string::~string((string *)&__begin4);
        if (info._M_string_length != 0) {
          pCVar1 = ((callback_00.iface)->super_Interface).mCore;
          (*pCVar1->_vptr_Core[0x60])
                    (pCVar1,(ulong)(uint)((callback_00.iface)->super_Interface).handle.hid);
        }
        __begin4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        __begin4.m_it.primitive_iterator.m_it =
             (difference_type)
             std::
             _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
             ::_M_invoke;
        __begin4.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)std::
                _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1320:20)>
                ::_M_manager;
        __begin4.m_object = (pointer)callback_00.iface;
        loadTags((json *)pbVar19,
                 (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&__begin4);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&__begin4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets,"source",(allocator<char> *)&local_2c0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"targets",&local_399);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_2a0);
        bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                           ((json *)pbVar19,(string *)&__begin4,callback_00);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets,&local_2a0);
          bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                             ((json *)pbVar19,(string *)&__end4,callback_00);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_2a0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_2a0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets,&local_2a0);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_4_>
                      ((json *)pbVar19,(string *)&local_328,callback_00);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_2a0);
        std::__cxx11::string::~string((string *)&targets);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets,"destination",&local_399);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2c0,"targets",&local_329);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets
                       ,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_2c0);
        bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                           ((json *)pbVar19,(string *)&__begin4,callback_00);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets,&local_2c0);
          bVar16 = addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                             ((json *)pbVar19,(string *)&__end4,callback_00);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_2c0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_2c0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets,&local_2c0);
            addTargets<helics::loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Translator>(helics::Federate*,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&,helics::Translator&)::_lambda(std::__cxx11::string_const&)_5_>
                      ((json *)pbVar19,(string *)&local_328,callback_00);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&targets);
        std::__cxx11::string::~string((string *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"endpoints",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_110);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                           ((json *)pbVar19,(string *)&__begin4,
                            (anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_110);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                             ((json *)pbVar19,(string *)&__end4,
                              (anon_class_8_1_36d583d8)callback_00.iface);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_110._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_110._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_110);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__6>
                      ((json *)pbVar19,(string *)&local_328,
                       (anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"endpoints",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_130);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                           ((json *)pbVar19,(string *)&__begin4,
                            (anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_130);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                             ((json *)pbVar19,(string *)&__end4,
                              (anon_class_8_1_36d583d8)callback_00.iface);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_130._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_130._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_130);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__7>
                      ((json *)pbVar19,(string *)&local_328,
                       (anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"publications",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_150);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                           ((json *)pbVar19,(string *)&__begin4,
                            (anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_150);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                             ((json *)pbVar19,(string *)&__end4,
                              (anon_class_8_1_36d583d8)callback_00.iface);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_150._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_150._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_150);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__8>
                      ((json *)pbVar19,(string *)&local_328,
                       (anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"inputs",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_170);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                           ((json *)pbVar19,(string *)&__begin4,
                            (anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_170);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                             ((json *)pbVar19,(string *)&__end4,
                              (anon_class_8_1_36d583d8)callback_00.iface);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_170._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_170._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_170);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__9>
                      ((json *)pbVar19,(string *)&local_328,
                       (anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"source",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"filters",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_190);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                           ((json *)pbVar19,(string *)&__begin4,
                            (anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_190);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                             ((json *)pbVar19,(string *)&__end4,
                              (anon_class_8_1_36d583d8)callback_00.iface);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_190._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_190._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_190);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__10>
                      ((json *)pbVar19,(string *)&local_328,
                       (anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&targets_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&targets_1,"destination",(allocator<char> *)&info);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"filters",(allocator<char> *)&targets);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &targets_1,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end4,
                       &local_1b0);
        bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                           ((json *)pbVar19,(string *)&__begin4,
                            (anon_class_8_1_36d583d8)callback_00.iface);
        std::__cxx11::string::~string((string *)&__begin4);
        std::__cxx11::string::~string((string *)&__end4);
        if (!bVar16) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &__end4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&targets_1,&local_1b0);
          bVar16 = addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                             ((json *)pbVar19,(string *)&__end4,
                              (anon_class_8_1_36d583d8)callback_00.iface);
          std::__cxx11::string::~string((string *)&__end4);
          _Var15._M_p = local_1b0._M_dataplus._M_p;
          if (!bVar16) {
            iVar18 = toupper((int)*local_1b0._M_dataplus._M_p);
            *_Var15._M_p = (char)iVar18;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_328,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &targets_1,&local_1b0);
            addTargets<helics::Federate::registerConnectorInterfacesJsonDetail(helics::fileops::JsonBuffer_const&)::__11>
                      ((json *)pbVar19,(string *)&local_328,
                       (anon_class_8_1_36d583d8)callback_00.iface);
            std::__cxx11::string::~string((string *)local_328._M_pod_data);
          }
        }
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&targets_1);
        bVar16 = this->strictConfigChecking;
        bVar17 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::contains<const_char_(&)[11],_0>
                           ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)pbVar19,(char (*) [11])"properties");
        if (bVar17) {
          pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     *)nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>(pbVar19,"properties");
          if (*pbVar19 ==
              (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               )0x2) {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::cbegin((const_iterator *)&__begin4,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)pbVar19);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::cend((const_iterator *)&__end4,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)pbVar19);
            while (bVar17 = nlohmann::json_abi_v3_11_3::detail::
                            iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            ::
                            operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                      ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__begin4,
                                       (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__end4), bVar17) {
              pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                        *)&__begin4);
              bVar17 = nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::contains<const_char_(&)[5],_0>
                                 ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)pbVar19,(char (*) [5])0x39312d);
              if ((bVar17) &&
                 (bVar17 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           ::contains<const_char_(&)[6],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                       *)pbVar19,(char (*) [6])0x3748f1), bVar17)) {
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar19,"value");
                if ((byte)((pvVar20->m_data).m_type - number_integer) < 3) {
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar19,"name");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_328,pvVar20);
                  uVar14 = local_328._8_8_;
                  uVar13 = local_328._M_unused._0_8_;
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar19,"value");
                  dVar2 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::get_impl<double,_0>(pvVar20);
                  (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                            (SUB84(dVar2,0),callback_00.iface,uVar14,uVar13);
                }
                else {
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar19,"name");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_328,pvVar20);
                  uVar14 = local_328._8_8_;
                  uVar13 = local_328._M_unused._0_8_;
                  pvVar20 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                            ::operator[]<char_const>(pbVar19,"value");
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&targets_1,pvVar20);
                  (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                            (callback_00.iface,uVar14,uVar13);
                  std::__cxx11::string::~string((string *)&targets_1);
                }
                std::__cxx11::string::~string((string *)local_328._M_pod_data);
              }
              else {
                if (bVar16 != false) goto LAB_001feb9b;
                message_05._M_str = "interface properties require \"name\" and \"value\" fields";
                message_05._M_len = 0x36;
                logMessage(this,3,message_05);
              }
              nlohmann::json_abi_v3_11_3::detail::
              iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                            *)&__begin4);
            }
          }
          else {
            bVar17 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     ::contains<const_char_(&)[5],_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)pbVar19,(char (*) [5])0x39312d);
            if ((bVar17) &&
               (bVar17 = nlohmann::json_abi_v3_11_3::
                         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         ::contains<const_char_(&)[6],_0>
                                   ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)pbVar19,(char (*) [6])0x3748f1), bVar17)) {
              pvVar20 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar19,"value");
              if ((byte)((pvVar20->m_data).m_type - number_integer) < 3) {
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar19,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((string *)&__begin4,pvVar20);
                iVar12 = __begin4.m_it.object_iterator;
                pbVar11 = __begin4.m_object;
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar19,"value");
                dVar2 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::get_impl<double,_0>(pvVar20);
                (*((callback_00.iface)->super_Interface)._vptr_Interface[5])
                          (SUB84(dVar2,0),callback_00.iface,iVar12._M_node,pbVar11);
              }
              else {
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar19,"name");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((string *)&__begin4,pvVar20);
                iVar12 = __begin4.m_it.object_iterator;
                pbVar11 = __begin4.m_object;
                pvVar20 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>(pbVar19,"value");
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::
                get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__end4,pvVar20);
                (*((callback_00.iface)->super_Interface)._vptr_Interface[6])
                          (callback_00.iface,iVar12._M_node,pbVar11);
                std::__cxx11::string::~string((string *)&__end4);
              }
              std::__cxx11::string::~string((string *)&__begin4);
            }
            else {
              if (bVar16 != false) {
LAB_001feb9b:
                message_08._M_str = "interface properties require \"name\" and \"value\" fields";
                message_08._M_len = 0x36;
                logMessage(this,0,message_08);
                pIVar23 = (InvalidParameter *)__cxa_allocate_exception(0x28);
                message_00._M_str = "interface properties require \"name\" and \"value\" fields";
                message_00._M_len = 0x36;
                InvalidParameter::InvalidParameter(pIVar23,message_00);
                __cxa_throw(pIVar23,&InvalidParameter::typeinfo,HelicsException::~HelicsException);
              }
              message_06._M_str = "interface properties require \"name\" and \"value\" fields";
              message_06._M_len = 0x36;
              logMessage(this,3,message_06);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&operation);
      std::__cxx11::string::~string((string *)&outputType);
      std::__cxx11::string::~string((string *)&inputType);
      std::__cxx11::string::~string((string *)&key);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++(&__begin2);
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_1e0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin4,"globals",(allocator<char> *)local_328._M_pod_data);
  __end4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  __end4.m_it.primitive_iterator.m_it =
       (difference_type)
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1547:39)>
       ::_M_invoke;
  __end4.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        *)std::
          _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1547:39)>
          ::_M_manager;
  __end4.m_object = (pointer)this;
  arrayPairProcess((json *)&local_1e0,(string *)&__begin4,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&__end4);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&__end4);
  std::__cxx11::string::~string((string *)&__begin4);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_1e0);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_1f0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__begin4,"aliases",(allocator<char> *)local_328._M_pod_data);
  __end4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  __end4.m_it.primitive_iterator.m_it =
       (difference_type)
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1550:39)>
       ::_M_invoke;
  __end4.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        *)std::
          _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1550:39)>
          ::_M_manager;
  __end4.m_object = (pointer)this;
  arrayPairProcess((json *)&local_1f0,(string *)&__begin4,
                   (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&__end4);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&__end4);
  std::__cxx11::string::~string((string *)&__begin4);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_1f0);
  __begin4.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  __begin4.m_it.primitive_iterator.m_it =
       (difference_type)
       std::
       _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1554:20)>
       ::_M_invoke;
  __begin4.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        *)std::
          _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Federate.cpp:1554:20)>
          ::_M_manager;
  __begin4.m_object = (pointer)this;
  loadTags((json *)this_00,
           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            *)&__begin4);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&__begin4);
  bVar16 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[7],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)this_00,(char (*) [7])0x37115e);
  if (bVar16) {
    __begin4.m_object =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(this_00,"helics");
    registerConnectorInterfacesJsonDetail(this,(JsonBuffer *)&__begin4);
  }
  bVar16 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[21],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)this_00,(char (*) [21])"potential_interfaces");
  if ((bVar16) ||
     (bVar16 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::contains<const_char_(&)[30],_0>
                         ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)this_00,(char (*) [30])"potential_interface_templates"), bVar16)) {
    this_01 = (this->potManager)._M_t.
              super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
              .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
    if (this_01 == (PotentialInterfacesManager *)0x0) {
      __end4.m_object =
           (pointer)(this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      local_328._M_unused._M_object = this;
      std::make_unique<helics::PotentialInterfacesManager,helics::Core*,helics::Federate*>
                ((Core **)&__begin4,(Federate **)&__end4);
      pbVar11 = __begin4.m_object;
      __begin4.m_object = (pointer)0x0;
      std::
      __uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ::reset((__uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
               *)&this->potManager,(pointer)pbVar11);
      std::
      unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ::~unique_ptr((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                     *)&__begin4);
      this_01 = (this->potManager)._M_t.
                super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl;
    }
    PotentialInterfacesManager::loadPotentialInterfaces(this_01,(json *)this_00);
    this->hasPotentialInterfaces = true;
  }
  return;
}

Assistant:

void Federate::registerConnectorInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuffer)
{
    using fileops::getOrDefault;
    const auto& json = jsonBuffer.json();
    bool defaultGlobal = false;
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("filters")) {
        for (const auto& filt : iface["filters"]) {
            const std::string key = getOrDefault(filt, "name", emptyStr);
            const std::string inputType = getOrDefault(filt, "inputType", emptyStr);
            const std::string outputType = getOrDefault(filt, "outputType", emptyStr);
            const bool cloningFlag = getOrDefault(filt, "cloning", false);
            const bool useTypes = !((inputType.empty()) && (outputType.empty()));
            const bool global = fileops::getOrDefault(filt, "global", defaultGlobal);
            const std::string operation =
                getOrDefault(filt,
                             "operation",
                             (cloningFlag) ? std::string("clone") : std::string("custom"));

            auto opType = filterTypeFromString(operation);
            if (!checkValidFilterType(useTypes, opType, operation)) {
                continue;
            }
            auto& filter =
                generateFilter(this, global, cloningFlag, key, opType, inputType, outputType);
            loadOptions(this, filt, filter);

            addTargetVariations(filt, "source", "endpoints", [&filter](const std::string& target) {
                filter.addSourceTarget(target);
            });
            addTargetVariations(filt,
                                "destination",
                                "endpoints",
                                [&filter](const std::string& target) {
                                    filter.addDestinationTarget(target);
                                });

            if (cloningFlag) {
                addTargets(filt, "delivery", [&filter](const std::string& target) {
                    static_cast<CloningFilter&>(filter).addDeliveryEndpoint(target);
                });
            }

            loadPropertiesJson(this, filter, filt, strictConfigChecking);
        }
    }
    if (iface.contains("translators")) {
        for (const auto& trans : iface["translators"]) {
            const std::string key = getOrDefault(trans, "name", emptyStr);

            std::string ttype = getOrDefault(trans, "type", std::string("custom"));
            auto opType = translatorTypeFromString(ttype);
            auto etype = fileops::getOrDefault(trans, "endpointtype", emptyStr);
            auto units = fileops::getOrDefault(trans, "unit", emptyStr);
            fileops::replaceIfMember(trans, "units", units);
            const bool global = fileops::getOrDefault(trans, "global", defaultGlobal);

            if (opType == TranslatorTypes::UNRECOGNIZED) {
                if (strictConfigChecking) {
                    const std::string emessage =
                        fmt::format("unrecognized translator type:{}", ttype);
                    logMessage(HELICS_LOG_LEVEL_ERROR, emessage);

                    throw(InvalidParameter(emessage));
                }
                logMessage(HELICS_LOG_LEVEL_WARNING,
                           fmt::format("unrecognized translator operation:{}", ttype));
                continue;
            }
            auto& translator = generateTranslator(this, global, key, opType, etype, units);
            loadOptions(this, trans, translator);

            addTargetVariations(trans,
                                "source",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addSourceEndpoint(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "endpoints",
                                [&translator](const std::string& target) {
                                    translator.addDestinationEndpoint(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "publications",
                                [&translator](const std::string& target) {
                                    translator.addPublication(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "inputs",
                                [&translator](const std::string& target) {
                                    translator.addInputTarget(target);
                                });
            addTargetVariations(trans,
                                "source",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addSourceFilter(target);
                                });
            addTargetVariations(trans,
                                "destination",
                                "filters",
                                [&translator](const std::string& target) {
                                    translator.addDestinationFilter(target);
                                });
            loadPropertiesJson(this, translator, trans, strictConfigChecking);
        }
    }
    arrayPairProcess(json, "globals", [this](std::string_view key, std::string_view val) {
        setGlobal(key, val);
    });
    arrayPairProcess(json, "aliases", [this](std::string_view key, std::string_view val) {
        addAlias(key, val);
    });

    loadTags(json, [this](std::string_view tagname, std::string_view tagvalue) {
        this->setTag(tagname, tagvalue);
    });
    if (json.contains("helics")) {
        registerConnectorInterfacesJsonDetail(fileops::JsonBuffer(json["helics"]));
    }

    if (json.contains("potential_interfaces") || json.contains("potential_interface_templates")) {
        if (!potManager) {
            potManager = std::make_unique<PotentialInterfacesManager>(coreObject.get(), this);
        }
        potManager->loadPotentialInterfaces(json);
        hasPotentialInterfaces = true;
    }
}